

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonevector.h
# Opt level: O0

void __thiscall asmjit::v1_14::ZoneBitVector::or_(ZoneBitVector *this,ZoneBitVector *other)

{
  long lVar1;
  long lVar2;
  long *in_RSI;
  ZoneBitVector *in_RDI;
  uint32_t i;
  uint32_t commonBitWordCount;
  BitWord *src;
  BitWord *dst;
  uint local_4c;
  uint local_40;
  
  lVar1 = *(long *)in_RDI;
  lVar2 = *in_RSI;
  if (*(uint *)(in_RSI + 1) < *(uint *)(in_RDI + 8)) {
    local_4c = *(uint *)(in_RSI + 1);
  }
  else {
    local_4c = *(uint *)(in_RDI + 8);
  }
  for (local_40 = 0; local_40 < local_4c + 0x3f >> 6; local_40 = local_40 + 1) {
    *(ulong *)(lVar1 + (ulong)local_40 * 8) =
         *(ulong *)(lVar1 + (ulong)local_40 * 8) | *(ulong *)(lVar2 + (ulong)local_40 * 8);
  }
  _clearUnusedBits(in_RDI);
  return;
}

Assistant:

ASMJIT_FORCE_INLINE void or_(const ZoneBitVector& other) noexcept {
    BitWord* dst = _data;
    const BitWord* src = other._data;

    uint32_t commonBitWordCount = _wordsPerBits(Support::min(_size, other._size));
    for (uint32_t i = 0; i < commonBitWordCount; i++)
      dst[i] = dst[i] | src[i];
    _clearUnusedBits();
  }